

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::Tree::Tree(Tree *this,size_t node_capacity,size_t arena_capacity,Callbacks *cb)

{
  Callbacks *in_RDX;
  Tree *in_RSI;
  size_t in_stack_00000038;
  Tree *in_stack_00000040;
  size_t in_stack_00000258;
  Tree *in_stack_00000260;
  
  Tree(in_RSI,in_RDX);
  reserve(in_stack_00000260,in_stack_00000258);
  reserve_arena(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

Tree::Tree(size_t node_capacity, size_t arena_capacity, Callbacks const& cb)
    : Tree(cb)
{
    reserve(node_capacity);
    reserve_arena(arena_capacity);
}